

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O1

void Fraig_TableResizeF(Fraig_HashTable_t *p,int fUseSimR)

{
  uint uVar1;
  Fraig_Node_t **ppFVar2;
  ulong uVar3;
  uint uVar4;
  Fraig_Node_t **__s;
  Fraig_Node_t *pFVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Fraig_Node_t *pFVar10;
  Fraig_Node_t *pFVar11;
  timespec ts;
  timespec local_40;
  
  clock_gettime(3,&local_40);
  uVar1 = p->nBins;
  uVar7 = uVar1 * 2 - 1;
  while( true ) {
    do {
      uVar8 = uVar7 + 1;
      uVar4 = uVar7 & 1;
      uVar7 = uVar8;
    } while (uVar4 != 0);
    if (uVar8 < 9) break;
    iVar6 = 5;
    while (uVar8 % (iVar6 - 2U) != 0) {
      uVar4 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar8 < uVar4) goto LAB_005ec529;
    }
  }
LAB_005ec529:
  __s = (Fraig_Node_t **)malloc((long)(int)uVar8 << 3);
  iVar6 = 0;
  memset(__s,0,(long)(int)uVar8 << 3);
  if (0 < (int)uVar1) {
    ppFVar2 = p->pBins;
    uVar9 = 0;
    iVar6 = 0;
    do {
      pFVar11 = ppFVar2[uVar9];
      if (pFVar11 != (Fraig_Node_t *)0x0) {
        pFVar5 = pFVar11->pNextF;
        do {
          pFVar10 = pFVar5;
          uVar3 = (ulong)(&pFVar11->uHashR)[fUseSimR == 0] % (ulong)uVar8;
          pFVar11->pNextF = __s[uVar3];
          __s[uVar3] = pFVar11;
          if (pFVar10 == (Fraig_Node_t *)0x0) {
            pFVar5 = (Fraig_Node_t *)0x0;
          }
          else {
            pFVar5 = pFVar10->pNextF;
          }
          iVar6 = iVar6 + 1;
          pFVar11 = pFVar10;
        } while (pFVar10 != (Fraig_Node_t *)0x0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar1);
  }
  if (iVar6 == p->nEntries) {
    if (p->pBins != (Fraig_Node_t **)0x0) {
      free(p->pBins);
      p->pBins = (Fraig_Node_t **)0x0;
    }
    p->pBins = __s;
    p->nBins = uVar8;
    return;
  }
  __assert_fail("Counter == p->nEntries",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                ,0x14a,"void Fraig_TableResizeF(Fraig_HashTable_t *, int)");
}

Assistant:

void Fraig_TableResizeF( Fraig_HashTable_t * p, int fUseSimR )
{
    Fraig_Node_t ** pBinsNew;
    Fraig_Node_t * pEnt, * pEnt2;
    int nBinsNew, Counter, i;
    abctime clk;
    unsigned Key;

clk = Abc_Clock();
    // get the new table size
    nBinsNew = Abc_PrimeCudd(2 * p->nBins); 
    // allocate a new array
    pBinsNew = ABC_ALLOC( Fraig_Node_t *, nBinsNew );
    memset( pBinsNew, 0, sizeof(Fraig_Node_t *) * nBinsNew );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < p->nBins; i++ )
        Fraig_TableBinForEachEntrySafeF( p->pBins[i], pEnt, pEnt2 )
        {
            if ( fUseSimR )
                Key = pEnt->uHashR % nBinsNew;
            else
                Key = pEnt->uHashD % nBinsNew;
            pEnt->pNextF = pBinsNew[Key];
            pBinsNew[Key] = pEnt;
            Counter++;
        }
    assert( Counter == p->nEntries );
//    printf( "Increasing the functional table size from %6d to %6d. ", p->nBins, nBinsNew );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    // replace the table and the parameters
    ABC_FREE( p->pBins );
    p->pBins = pBinsNew;
    p->nBins = nBinsNew;
}